

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  value_type vVar1;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  undefined8 *in_RDI;
  size_t length;
  char *base;
  size_t i;
  size_t num_keys;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  value_type_conflict2 *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  long *plVar5;
  undefined8 *__new_size;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *in_stack_ffffffffffffffa0;
  Slice local_48;
  size_t local_38;
  char *local_30;
  ulong local_28;
  undefined8 local_20;
  undefined4 local_14;
  size_type local_10;
  
  local_10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 5));
  if (local_10 == 0) {
    local_14 = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_ffffffffffffff80,(value_type_conflict2 *)in_stack_ffffffffffffff78);
  }
  else {
    __new_size = in_RDI + 5;
    local_20 = std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (in_stack_ffffffffffffffa0,(size_type)__new_size);
    for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 1) {
      lVar2 = std::__cxx11::string::data();
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 5),
                          local_28);
      local_30 = (char *)(lVar2 + *pvVar3);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 5),
                          local_28 + 1);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 5),
                          local_28);
      local_38 = vVar1 - *pvVar3;
      Slice::Slice(&local_48,local_30,local_38);
      pvVar4 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                         ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)(in_RDI + 0xc),
                          local_28);
      pvVar4->data_ = local_48.data_;
      pvVar4->size_ = local_48.size_;
    }
    __x = (value_type_conflict2 *)(in_RDI + 0xf);
    std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_ffffffffffffff80,__x);
    plVar5 = (long *)*in_RDI;
    pvVar4 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                       ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)(in_RDI + 0xc),0)
    ;
    (**(code **)(*plVar5 + 0x18))(plVar5,pvVar4,local_10 & 0xffffffff,in_RDI + 8);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::clear
              ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)0x11b3e2);
    std::__cxx11::string::clear();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11b3fe);
  }
  return;
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back((uint32_t)result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back((uint32_t)result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}